

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

void swapAndFlip(word *pAfter,int nVars,int iVarInPosition,int jVar,char *pCanonPerm,
                uint *pUCanonPhase)

{
  char cVar1;
  uint uVar2;
  
  swap_ij(pAfter,nVars,iVarInPosition,jVar);
  cVar1 = pCanonPerm[iVarInPosition];
  pCanonPerm[iVarInPosition] = pCanonPerm[jVar];
  pCanonPerm[jVar] = cVar1;
  uVar2 = *pUCanonPhase;
  if (((uVar2 >> ((byte)jVar & 0x1f) ^ uVar2 >> ((byte)iVarInPosition & 0x1f)) & 1) != 0) {
    uVar2 = uVar2 ^ 1 << ((byte)jVar & 0x1f) ^ 1 << (iVarInPosition & 0x1fU);
    *pUCanonPhase = uVar2;
  }
  if ((uVar2 & 1 << ((byte)iVarInPosition & 0x1f)) == 0) {
    return;
  }
  Kit_TruthChangePhase_64bit(pAfter,nVars,iVarInPosition);
  return;
}

Assistant:

void swapAndFlip(word* pAfter, int nVars, int iVarInPosition, int jVar, char * pCanonPerm, unsigned* pUCanonPhase)
{
    int Temp;
    swap_ij(pAfter, nVars, iVarInPosition, jVar);
    
    Temp = pCanonPerm[iVarInPosition];
    pCanonPerm[iVarInPosition] = pCanonPerm[jVar];
    pCanonPerm[jVar] = Temp;
    
    if ( ((*pUCanonPhase & (1 << iVarInPosition)) > 0) != ((*pUCanonPhase & (1 << jVar)) > 0) )
    {
        *pUCanonPhase ^= (1 << iVarInPosition);
        *pUCanonPhase ^= (1 << jVar);
    }
    if((*pUCanonPhase>>iVarInPosition) & 1)
        Kit_TruthChangePhase_64bit( pAfter, nVars, iVarInPosition );
    
}